

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::TorsionTypesSectionParser::parseLine
          (TorsionTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  uint in_ECX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  TorsionTypeParser *in_stack_00000010;
  OpenMDException *e;
  string remainder;
  string at4;
  string at3;
  string at2;
  string at1;
  int nTokens;
  string torsionConvention;
  TorsionType *torsionType;
  TorsionTypeParser ttParser;
  StringTokenizer tokenizer;
  string *in_stack_00000378;
  TorsionTypeParser *in_stack_00000380;
  ForceFieldOptions *in_stack_fffffffffffffdf8;
  StringTokenizer *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  locale *this_00;
  string *delim;
  string *in_stack_fffffffffffffe38;
  StringTokenizer *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  ForceField *in_stack_fffffffffffffe60;
  StringTokenizer *in_stack_fffffffffffffe68;
  string local_180 [32];
  string local_160 [8];
  StringTokenizer *in_stack_fffffffffffffea8;
  string local_140 [32];
  undefined4 local_120;
  int local_11c;
  locale local_118 [8];
  string local_110 [32];
  StringTokenizer *local_f0;
  TorsionTypeParser local_e8;
  undefined1 local_99 [125];
  uint local_1c;
  
  delim = (string *)local_99;
  local_1c = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_fffffffffffffe40->tokenString_,(char *)in_stack_fffffffffffffe38,
             (allocator<char> *)delim);
  StringTokenizer::StringTokenizer(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,delim);
  std::__cxx11::string::~string((string *)(local_99 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_99);
  TorsionTypeParser::TorsionTypeParser(in_stack_00000010);
  local_f0 = (StringTokenizer *)0x0;
  ForceFieldOptions::getTorsionAngleConvention_abi_cxx11_(in_stack_fffffffffffffdf8);
  this_00 = local_118;
  std::locale::locale(this_00);
  toUpper<std::__cxx11::string>(in_RDI,this_00);
  std::locale::~locale(local_118);
  iVar1 = std::__cxx11::string::compare((char *)local_110);
  if (iVar1 == 0) {
    TorsionTypeParser::Trans180(&local_e8);
  }
  else {
    TorsionTypeParser::Cis180(&local_e8);
  }
  local_11c = StringTokenizer::countTokens
                        ((StringTokenizer *)
                         CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  if (local_11c < 5) {
    snprintf(painCave.errMsg,2000,"TorsionTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)local_1c);
    painCave.isFatal = 1;
    simError();
    local_120 = 1;
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffea8);
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffea8);
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffea8);
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffea8);
    StringTokenizer::getRemainingString_abi_cxx11_(in_stack_fffffffffffffe68);
    in_stack_fffffffffffffe00 =
         (StringTokenizer *)TorsionTypeParser::parseLine(in_stack_00000380,in_stack_00000378);
    local_f0 = in_stack_fffffffffffffe00;
    if (in_stack_fffffffffffffe00 != (StringTokenizer *)0x0) {
      ForceField::addTorsionType
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe48,&in_stack_fffffffffffffe40->tokenString_,
                 (TorsionType *)in_stack_fffffffffffffe38);
    }
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe60);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_140);
    local_120 = 0;
  }
  std::__cxx11::string::~string(local_110);
  TorsionTypeParser::~TorsionTypeParser((TorsionTypeParser *)0x369838);
  StringTokenizer::~StringTokenizer(in_stack_fffffffffffffe00);
  return;
}

Assistant:

void TorsionTypesSectionParser::parseLine(ForceField& ff,
                                            const std::string& line,
                                            int lineNo) {
    StringTokenizer tokenizer(line);
    TorsionTypeParser ttParser;
    TorsionType* torsionType = NULL;

    std::string torsionConvention = options_.getTorsionAngleConvention();
    toUpper(torsionConvention);

    if (torsionConvention.compare("180_IS_TRANS") == 0)
      ttParser.Trans180();
    else
      ttParser.Cis180();

    int nTokens = tokenizer.countTokens();

    if (nTokens < 5) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "TorsionTypesSectionParser Error: Not enough tokens at line %d\n",
          lineNo);
      painCave.isFatal = 1;
      simError();
      return;
    }

    std::string at1       = tokenizer.nextToken();
    std::string at2       = tokenizer.nextToken();
    std::string at3       = tokenizer.nextToken();
    std::string at4       = tokenizer.nextToken();
    std::string remainder = tokenizer.getRemainingString();

    try {
      torsionType = ttParser.parseLine(remainder);
    } catch (OpenMDException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "TorsionTypesSectionParser Error: %s "
               "at line %d\n",
               e.what(), lineNo);
      painCave.isFatal = 1;
      simError();
    }

    if (torsionType != NULL) {
      ff.addTorsionType(at1, at2, at3, at4, torsionType);
    }
  }